

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

int rw::strcmp_ci(char *s1,char *s2)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    uVar1 = tolower((int)s1[lVar3]);
    iVar2 = tolower((int)s2[lVar3]);
    iVar2 = (int)(char)uVar1 - (int)(char)iVar2;
    if (iVar2 != 0) {
      return iVar2;
    }
    if ((uVar1 & 0xff) == 0) break;
    lVar3 = lVar3 + 1;
  }
  return 0;
}

Assistant:

int
strcmp_ci(const char *s1, const char *s2)
{
	char c1, c2;
	for(;;){
		c1 = tolower(*s1);
		c2 = tolower(*s2);
		if(c1 != c2)
			return c1 - c2;
		if(c1 == '\0')
			return 0;
		s1++;
		s2++;
	}
}